

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     BinaryUpdateLoop<duckdb::RegrSlopeState,double,double,duckdb::RegrSlopeOperation>
               (double *adata,AggregateInputData *aggr_input_data,double *bdata,
               RegrSlopeState *state,idx_t count,SelectionVector *asel,SelectionVector *bsel,
               ValidityMask *avalidity,ValidityMask *bvalidity)

{
  bool bVar1;
  AggregateInputData *in_RSI;
  AggregateBinaryInput *in_R8;
  SelectionVector *in_R9;
  idx_t i_1;
  idx_t i;
  AggregateBinaryInput input;
  AggregateBinaryInput *in_stack_ffffffffffffff98;
  AggregateBinaryInput *pAVar2;
  double *in_stack_ffffffffffffffa0;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffa8;
  RegrSlopeState *in_stack_ffffffffffffffb0;
  
  AggregateBinaryInput::AggregateBinaryInput
            ((AggregateBinaryInput *)&stack0xffffffffffffffa8,in_RSI,(ValidityMask *)input.input,
             input.left_mask);
  bVar1 = RegrSlopeOperation::IgnoreNull();
  if ((!bVar1) ||
     ((bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                         ((TemplatedValidityMask<unsigned_long> *)input.input), bVar1 &&
      (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                         (&(input.left_mask)->super_TemplatedValidityMask<unsigned_long>), bVar1))))
  {
    for (pAVar2 = (AggregateBinaryInput *)0x0; pAVar2 < in_R8;
        pAVar2 = (AggregateBinaryInput *)((long)&pAVar2->input + 1)) {
      SelectionVector::get_index(in_R9,(idx_t)pAVar2);
      SelectionVector::get_index((SelectionVector *)i,(idx_t)pAVar2);
      RegrSlopeOperation::Operation<double,double,duckdb::RegrSlopeState,duckdb::RegrSlopeOperation>
                (in_stack_ffffffffffffffb0,(double *)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0,pAVar2);
    }
  }
  else {
    for (pAVar2 = (AggregateBinaryInput *)0x0; pAVar2 < in_R8;
        pAVar2 = (AggregateBinaryInput *)((long)&pAVar2->input + 1)) {
      SelectionVector::get_index(in_R9,(idx_t)pAVar2);
      SelectionVector::get_index((SelectionVector *)i,(idx_t)pAVar2);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffffa8,(idx_t)pAVar2);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (in_stack_ffffffffffffffa8,(idx_t)pAVar2), bVar1)) {
        RegrSlopeOperation::
        Operation<double,double,duckdb::RegrSlopeState,duckdb::RegrSlopeOperation>
                  (in_stack_ffffffffffffffb0,(double *)in_stack_ffffffffffffffa8,(double *)pAVar2,
                   in_stack_ffffffffffffff98);
      }
    }
  }
  return;
}

Assistant:

static inline void BinaryUpdateLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                    const B_TYPE *__restrict bdata, STATE_TYPE *__restrict state, idx_t count,
	                                    const SelectionVector &asel, const SelectionVector &bsel,
	                                    ValidityMask &avalidity, ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
					                                                       input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
				                                                       input);
			}
		}
	}